

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTriangleMeshShape.cpp
# Opt level: O3

void __thiscall
chrono::ChTriangleMeshShape::SetMesh
          (ChTriangleMeshShape *this,shared_ptr<chrono::geometry::ChTriangleMeshConnected> *mesh,
          bool load_materials)

{
  vector<std::shared_ptr<chrono::ChVisualMaterial>,_std::allocator<std::shared_ptr<chrono::ChVisualMaterial>_>_>
  *this_00;
  pointer *ppfVar1;
  float fVar2;
  size_t __n;
  pointer piVar3;
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  pointer pmVar6;
  pointer pmVar7;
  _Alloc_hider _Var8;
  undefined1 auVar9 [56];
  undefined1 auVar10 [40];
  bool bVar11;
  int iVar12;
  ostream *poVar13;
  long *plVar14;
  ulong uVar15;
  pointer psVar16;
  char cVar17;
  pointer pfVar18;
  pointer psVar19;
  long lVar20;
  iterator __position;
  element_type *peVar21;
  ulong uVar22;
  string warn;
  vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> materials;
  string err;
  attrib_t att;
  string mtl_base;
  vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> shapes;
  
  (this->trimesh).
  super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (mesh->
       super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->trimesh).
              super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,
             &(mesh->
              super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
              )._M_refcount);
  peVar21 = (mesh->
            super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
            )._M_ptr;
  filesystem::path::path((path *)&warn,&peVar21->m_filename);
  filesystem::path::parent_path((path *)&att,(path *)&warn);
  filesystem::path::str_abi_cxx11_(&mtl_base,(path *)&att,native_path);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&warn._M_string_length);
  shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((load_materials) && ((peVar21->m_filename)._M_string_length != 0)) {
    warn._M_dataplus._M_p = (pointer)&warn.field_2;
    att._0_64_ = ZEXT464(0) << 0x40;
    att.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    att.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    warn._M_string_length = 0;
    err._M_string_length = 0;
    att.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    att.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    att.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    att.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    att.texcoord_ws.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    att.texcoord_ws.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    warn.field_2._M_local_buf[0] = '\0';
    err.field_2._M_local_buf[0] = '\0';
    err._M_dataplus._M_p = (pointer)&err.field_2;
    att.texcoord_ws.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         att.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_finish;
    att.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = att.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    bVar11 = tinyobj::LoadObj(&att,&shapes,&materials,&warn,&err,
                              (peVar21->m_filename)._M_dataplus._M_p,mtl_base._M_dataplus._M_p,true,
                              true);
    pmVar7 = materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pmVar6 = materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (!bVar11) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Error loading OBJ file ",0x17);
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,(peVar21->m_filename)._M_dataplus._M_p,
                           (peVar21->m_filename)._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
      std::ostream::put((char)poVar13);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"   tiny_obj warning message: ",0x1d);
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,warn._M_dataplus._M_p,warn._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
      std::ostream::put((char)poVar13);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"   tiny_obj error message:   ",0x1d);
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,err._M_dataplus._M_p,err._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
      std::ostream::put((char)poVar13);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"No materials loaded.",0x14);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
      std::ostream::put('\x10');
      std::ostream::flush();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)err._M_dataplus._M_p != &err.field_2) {
      operator_delete(err._M_dataplus._M_p,
                      CONCAT71(err.field_2._M_allocated_capacity._1_7_,err.field_2._M_local_buf[0])
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)warn._M_dataplus._M_p != &warn.field_2) {
      operator_delete(warn._M_dataplus._M_p,
                      CONCAT71(warn.field_2._M_allocated_capacity._1_7_,warn.field_2._M_local_buf[0]
                              ) + 1);
    }
    if (att.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(att.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)att.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)att.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (att.texcoord_ws.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(att.texcoord_ws.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)att.texcoord_ws.super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)att.texcoord_ws.super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (att.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(att.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)att.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)att.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (att.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(att.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)att.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)att.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (att.vertex_weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(att.vertex_weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)att.vertex_weights.super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)att.vertex_weights.super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (!bVar11) goto LAB_0081926a;
    if (bVar11 && pmVar6 != pmVar7) {
      this_00 = &(this->super_ChVisualShape).material_list;
      std::
      vector<std::shared_ptr<chrono::ChVisualMaterial>,_std::allocator<std::shared_ptr<chrono::ChVisualMaterial>_>_>
      ::clear(this_00);
      if (materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        ppfVar1 = &att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        lVar20 = 0;
        uVar22 = 0;
        do {
          err._M_dataplus._M_p = (pointer)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<chrono::ChVisualMaterial,std::allocator<chrono::ChVisualMaterial>>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&err._M_string_length,
                     (ChVisualMaterial **)&err,(allocator<chrono::ChVisualMaterial> *)&att);
          att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish._0_4_ =
               *(undefined4 *)
                ((long)(materials.
                        super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                        ._M_impl.super__Vector_impl_data._M_start)->ambient + lVar20 + 8);
          att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start =
               *(pointer *)
                ((long)(materials.
                        super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                        ._M_impl.super__Vector_impl_data._M_start)->ambient + lVar20);
          ChVisualMaterial::SetAmbientColor
                    ((ChVisualMaterial *)err._M_dataplus._M_p,(ChColor *)&att);
          att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish._0_4_ =
               *(undefined4 *)
                ((long)(materials.
                        super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                        ._M_impl.super__Vector_impl_data._M_start)->diffuse + lVar20 + 8);
          att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start =
               *(pointer *)
                ((long)(materials.
                        super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                        ._M_impl.super__Vector_impl_data._M_start)->diffuse + lVar20);
          ChVisualMaterial::SetDiffuseColor
                    ((ChVisualMaterial *)err._M_dataplus._M_p,(ChColor *)&att);
          att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish._0_4_ =
               *(undefined4 *)
                ((long)(materials.
                        super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                        ._M_impl.super__Vector_impl_data._M_start)->specular + lVar20 + 8);
          att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start =
               *(pointer *)
                ((long)(materials.
                        super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                        ._M_impl.super__Vector_impl_data._M_start)->specular + lVar20);
          ChVisualMaterial::SetSpecularColor
                    ((ChVisualMaterial *)err._M_dataplus._M_p,(ChColor *)&att);
          att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish._0_4_ =
               *(undefined4 *)
                ((long)(materials.
                        super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                        ._M_impl.super__Vector_impl_data._M_start)->emission + lVar20 + 8);
          att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start =
               *(pointer *)
                ((long)(materials.
                        super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                        ._M_impl.super__Vector_impl_data._M_start)->emission + lVar20);
          ChVisualMaterial::SetEmissiveColor
                    ((ChVisualMaterial *)err._M_dataplus._M_p,(ChColor *)&att);
          ChVisualMaterial::SetMetallic
                    ((ChVisualMaterial *)err._M_dataplus._M_p,
                     *(float *)((long)(&(materials.
                                         super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                        reflection_texopt + 1) + lVar20 + 4));
          ChVisualMaterial::SetOpacity
                    ((ChVisualMaterial *)err._M_dataplus._M_p,
                     *(float *)((long)(materials.
                                       super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->emission +
                               lVar20 + 0x14));
          ChVisualMaterial::SetIllumination
                    ((ChVisualMaterial *)err._M_dataplus._M_p,
                     *(int *)((long)(materials.
                                     super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->emission +
                             lVar20 + 0x18));
          ChVisualMaterial::SetRoughness
                    ((ChVisualMaterial *)err._M_dataplus._M_p,
                     *(float *)((long)(&(materials.
                                         super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                        reflection_texopt + 1) + lVar20));
          ChVisualMaterial::SetSpecularExponent
                    ((ChVisualMaterial *)err._M_dataplus._M_p,
                     *(float *)((long)(materials.
                                       super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->emission +
                               lVar20 + 0xc));
          fVar2 = *(float *)((long)(&(materials.
                                      super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->reflection_texopt
                                   + 1) + lVar20 + 4);
          if ((fVar2 != 0.0) || (NAN(fVar2))) {
LAB_008188b4:
            cVar17 = '\0';
          }
          else {
            fVar2 = *(float *)((long)(&(materials.
                                        super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                       reflection_texopt + 1) + lVar20);
            cVar17 = '\x01';
            if ((fVar2 != 0.5) || (NAN(fVar2))) goto LAB_008188b4;
          }
          err._M_dataplus._M_p[0x50] = cVar17;
          iVar12 = std::__cxx11::string::compare
                             ((char *)((long)(materials.
                                              super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->emission +
                                      lVar20 + 0x40));
          _Var8 = err._M_dataplus;
          if (iVar12 != 0) {
            warn._M_dataplus._M_p = (pointer)&warn.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&warn,mtl_base._M_dataplus._M_p,
                       mtl_base._M_dataplus._M_p + mtl_base._M_string_length);
            std::__cxx11::string::append((char *)&warn);
            plVar14 = (long *)std::__cxx11::string::_M_append
                                        ((char *)&warn,
                                         *(ulong *)((long)(materials.
                                                                                                                      
                                                  super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  emission + lVar20 + 0x40));
            auVar4 = (undefined1  [64])att._0_64_;
            auVar9 = (undefined1  [56])att._8_56_;
            att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)ppfVar1;
            auVar5 = (undefined1  [64])att._0_64_;
            pfVar18 = (pointer)(plVar14 + 2);
            att._24_40_ = auVar4._24_40_;
            auVar10 = (undefined1  [40])att._24_40_;
            if ((pointer)*plVar14 == pfVar18) {
              att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._0_16_ = auVar5._0_16_;
              att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = *(pointer *)pfVar18;
              att._32_32_ = auVar4._32_32_;
              att.vertex_weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)plVar14[3];
            }
            else {
              att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)*plVar14;
              att._0_64_ = CONCAT568(auVar9,att.vertices.
                                            super__Vector_base<float,_std::allocator<float>_>.
                                            _M_impl.super__Vector_impl_data._M_start);
              att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = *(pointer *)pfVar18;
              att._0_64_ = CONCAT4024(auVar10,att.vertices.
                                              super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data);
            }
            att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)plVar14[1];
            *plVar14 = (long)pfVar18;
            plVar14[1] = 0;
            *(undefined1 *)(plVar14 + 2) = 0;
            ChVisualMaterial::SetKdTexture((ChVisualMaterial *)_Var8._M_p,(string *)&att,1.0,1.0);
            if ((pointer *)
                att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != ppfVar1) {
              operator_delete(att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl
                              .super__Vector_impl_data._M_start,
                              (long)att.vertices.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)warn._M_dataplus._M_p != &warn.field_2) {
              operator_delete(warn._M_dataplus._M_p,
                              CONCAT71(warn.field_2._M_allocated_capacity._1_7_,
                                       warn.field_2._M_local_buf[0]) + 1);
            }
          }
          iVar12 = std::__cxx11::string::compare
                             ((char *)((long)(materials.
                                              super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->emission +
                                      lVar20 + 0x60));
          _Var8 = err._M_dataplus;
          if (iVar12 != 0) {
            warn._M_dataplus._M_p = (pointer)&warn.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&warn,mtl_base._M_dataplus._M_p,
                       mtl_base._M_dataplus._M_p + mtl_base._M_string_length);
            std::__cxx11::string::append((char *)&warn);
            plVar14 = (long *)std::__cxx11::string::_M_append
                                        ((char *)&warn,
                                         *(ulong *)((long)(materials.
                                                                                                                      
                                                  super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  emission + lVar20 + 0x60));
            auVar4 = (undefined1  [64])att._0_64_;
            auVar9 = (undefined1  [56])att._8_56_;
            att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)ppfVar1;
            auVar5 = (undefined1  [64])att._0_64_;
            pfVar18 = (pointer)(plVar14 + 2);
            att._24_40_ = auVar4._24_40_;
            auVar10 = (undefined1  [40])att._24_40_;
            if ((pointer)*plVar14 == pfVar18) {
              att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._0_16_ = auVar5._0_16_;
              att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = *(pointer *)pfVar18;
              att._32_32_ = auVar4._32_32_;
              att.vertex_weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)plVar14[3];
            }
            else {
              att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)*plVar14;
              att._0_64_ = CONCAT568(auVar9,att.vertices.
                                            super__Vector_base<float,_std::allocator<float>_>.
                                            _M_impl.super__Vector_impl_data._M_start);
              att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = *(pointer *)pfVar18;
              att._0_64_ = CONCAT4024(auVar10,att.vertices.
                                              super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data);
            }
            att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)plVar14[1];
            *plVar14 = (long)pfVar18;
            plVar14[1] = 0;
            *(undefined1 *)(plVar14 + 2) = 0;
            ChVisualMaterial::SetKsTexture((ChVisualMaterial *)_Var8._M_p,(string *)&att,1.0,1.0);
            if ((pointer *)
                att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != ppfVar1) {
              operator_delete(att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl
                              .super__Vector_impl_data._M_start,
                              (long)att.vertices.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)warn._M_dataplus._M_p != &warn.field_2) {
              operator_delete(warn._M_dataplus._M_p,
                              CONCAT71(warn.field_2._M_allocated_capacity._1_7_,
                                       warn.field_2._M_local_buf[0]) + 1);
            }
            err._M_dataplus._M_p[0x50] = '\x01';
          }
          iVar12 = std::__cxx11::string::compare
                             ((char *)((long)&((materials.
                                                super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->
                                              bump_texname)._M_dataplus._M_p + lVar20));
          _Var8 = err._M_dataplus;
          if (iVar12 != 0) {
            warn._M_dataplus._M_p = (pointer)&warn.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&warn,mtl_base._M_dataplus._M_p,
                       mtl_base._M_dataplus._M_p + mtl_base._M_string_length);
            std::__cxx11::string::append((char *)&warn);
            plVar14 = (long *)std::__cxx11::string::_M_append
                                        ((char *)&warn,
                                         *(ulong *)((long)&((materials.
                                                                                                                          
                                                  super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  bump_texname)._M_dataplus._M_p + lVar20));
            auVar4 = (undefined1  [64])att._0_64_;
            auVar9 = (undefined1  [56])att._8_56_;
            att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)ppfVar1;
            auVar5 = (undefined1  [64])att._0_64_;
            pfVar18 = (pointer)(plVar14 + 2);
            att._24_40_ = auVar4._24_40_;
            auVar10 = (undefined1  [40])att._24_40_;
            if ((pointer)*plVar14 == pfVar18) {
              att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._0_16_ = auVar5._0_16_;
              att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = *(pointer *)pfVar18;
              att._32_32_ = auVar4._32_32_;
              att.vertex_weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)plVar14[3];
            }
            else {
              att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)*plVar14;
              att._0_64_ = CONCAT568(auVar9,att.vertices.
                                            super__Vector_base<float,_std::allocator<float>_>.
                                            _M_impl.super__Vector_impl_data._M_start);
              att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = *(pointer *)pfVar18;
              att._0_64_ = CONCAT4024(auVar10,att.vertices.
                                              super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data);
            }
            att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)plVar14[1];
            *plVar14 = (long)pfVar18;
            plVar14[1] = 0;
            *(undefined1 *)(plVar14 + 2) = 0;
            ChVisualMaterial::SetNormalMapTexture
                      ((ChVisualMaterial *)_Var8._M_p,(string *)&att,1.0,1.0);
            if ((pointer *)
                att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != ppfVar1) {
              operator_delete(att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl
                              .super__Vector_impl_data._M_start,
                              (long)att.vertices.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)warn._M_dataplus._M_p != &warn.field_2) {
              operator_delete(warn._M_dataplus._M_p,
                              CONCAT71(warn.field_2._M_allocated_capacity._1_7_,
                                       warn.field_2._M_local_buf[0]) + 1);
            }
          }
          iVar12 = std::__cxx11::string::compare
                             ((char *)((long)((materials.
                                               super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                             roughness_texopt).origin_offset + lVar20 + -0x30));
          _Var8 = err._M_dataplus;
          if (iVar12 != 0) {
            warn._M_dataplus._M_p = (pointer)&warn.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&warn,mtl_base._M_dataplus._M_p,
                       mtl_base._M_dataplus._M_p + mtl_base._M_string_length);
            std::__cxx11::string::append((char *)&warn);
            plVar14 = (long *)std::__cxx11::string::_M_append
                                        ((char *)&warn,
                                         *(ulong *)((long)((materials.
                                                                                                                        
                                                  super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  roughness_texopt).origin_offset + lVar20 + -0x30))
            ;
            auVar4 = (undefined1  [64])att._0_64_;
            auVar9 = (undefined1  [56])att._8_56_;
            att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)ppfVar1;
            auVar5 = (undefined1  [64])att._0_64_;
            pfVar18 = (pointer)(plVar14 + 2);
            att._24_40_ = auVar4._24_40_;
            auVar10 = (undefined1  [40])att._24_40_;
            if ((pointer)*plVar14 == pfVar18) {
              att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._0_16_ = auVar5._0_16_;
              att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = *(pointer *)pfVar18;
              att._32_32_ = auVar4._32_32_;
              att.vertex_weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)plVar14[3];
            }
            else {
              att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)*plVar14;
              att._0_64_ = CONCAT568(auVar9,att.vertices.
                                            super__Vector_base<float,_std::allocator<float>_>.
                                            _M_impl.super__Vector_impl_data._M_start);
              att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = *(pointer *)pfVar18;
              att._0_64_ = CONCAT4024(auVar10,att.vertices.
                                              super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data);
            }
            att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)plVar14[1];
            *plVar14 = (long)pfVar18;
            plVar14[1] = 0;
            *(undefined1 *)(plVar14 + 2) = 0;
            ChVisualMaterial::SetNormalMapTexture
                      ((ChVisualMaterial *)_Var8._M_p,(string *)&att,1.0,1.0);
            if ((pointer *)
                att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != ppfVar1) {
              operator_delete(att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl
                              .super__Vector_impl_data._M_start,
                              (long)att.vertices.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)warn._M_dataplus._M_p != &warn.field_2) {
              operator_delete(warn._M_dataplus._M_p,
                              CONCAT71(warn.field_2._M_allocated_capacity._1_7_,
                                       warn.field_2._M_local_buf[0]) + 1);
            }
          }
          iVar12 = std::__cxx11::string::compare
                             ((char *)((long)(&(materials.
                                                super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->
                                               reflection_texopt + 1) + lVar20 + 0x20));
          _Var8 = err._M_dataplus;
          if (iVar12 != 0) {
            warn._M_dataplus._M_p = (pointer)&warn.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&warn,mtl_base._M_dataplus._M_p,
                       mtl_base._M_dataplus._M_p + mtl_base._M_string_length);
            std::__cxx11::string::append((char *)&warn);
            plVar14 = (long *)std::__cxx11::string::_M_append
                                        ((char *)&warn,
                                         *(ulong *)((long)(&(materials.
                                                                                                                          
                                                  super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  reflection_texopt + 1) + lVar20 + 0x20));
            auVar4 = (undefined1  [64])att._0_64_;
            auVar9 = (undefined1  [56])att._8_56_;
            att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)ppfVar1;
            auVar5 = (undefined1  [64])att._0_64_;
            pfVar18 = (pointer)(plVar14 + 2);
            att._24_40_ = auVar4._24_40_;
            auVar10 = (undefined1  [40])att._24_40_;
            if ((pointer)*plVar14 == pfVar18) {
              att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._0_16_ = auVar5._0_16_;
              att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = *(pointer *)pfVar18;
              att._32_32_ = auVar4._32_32_;
              att.vertex_weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)plVar14[3];
            }
            else {
              att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)*plVar14;
              att._0_64_ = CONCAT568(auVar9,att.vertices.
                                            super__Vector_base<float,_std::allocator<float>_>.
                                            _M_impl.super__Vector_impl_data._M_start);
              att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = *(pointer *)pfVar18;
              att._0_64_ = CONCAT4024(auVar10,att.vertices.
                                              super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data);
            }
            att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)plVar14[1];
            *plVar14 = (long)pfVar18;
            plVar14[1] = 0;
            *(undefined1 *)(plVar14 + 2) = 0;
            ChVisualMaterial::SetRoughnessTexture
                      ((ChVisualMaterial *)_Var8._M_p,(string *)&att,1.0,1.0);
            if ((pointer *)
                att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != ppfVar1) {
              operator_delete(att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl
                              .super__Vector_impl_data._M_start,
                              (long)att.vertices.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)warn._M_dataplus._M_p != &warn.field_2) {
              operator_delete(warn._M_dataplus._M_p,
                              CONCAT71(warn.field_2._M_allocated_capacity._1_7_,
                                       warn.field_2._M_local_buf[0]) + 1);
            }
            err._M_dataplus._M_p[0x50] = '\0';
          }
          iVar12 = std::__cxx11::string::compare
                             ((char *)((long)&((materials.
                                                super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->
                                              metallic_texname)._M_dataplus._M_p + lVar20));
          _Var8 = err._M_dataplus;
          if (iVar12 != 0) {
            warn._M_dataplus._M_p = (pointer)&warn.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&warn,mtl_base._M_dataplus._M_p,
                       mtl_base._M_dataplus._M_p + mtl_base._M_string_length);
            std::__cxx11::string::append((char *)&warn);
            plVar14 = (long *)std::__cxx11::string::_M_append
                                        ((char *)&warn,
                                         *(ulong *)((long)&((materials.
                                                                                                                          
                                                  super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  metallic_texname)._M_dataplus._M_p + lVar20));
            auVar4 = (undefined1  [64])att._0_64_;
            auVar9 = (undefined1  [56])att._8_56_;
            att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)ppfVar1;
            auVar5 = (undefined1  [64])att._0_64_;
            pfVar18 = (pointer)(plVar14 + 2);
            att._24_40_ = auVar4._24_40_;
            auVar10 = (undefined1  [40])att._24_40_;
            if ((pointer)*plVar14 == pfVar18) {
              att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._0_16_ = auVar5._0_16_;
              att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = *(pointer *)pfVar18;
              att._32_32_ = auVar4._32_32_;
              att.vertex_weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)plVar14[3];
            }
            else {
              att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)*plVar14;
              att._0_64_ = CONCAT568(auVar9,att.vertices.
                                            super__Vector_base<float,_std::allocator<float>_>.
                                            _M_impl.super__Vector_impl_data._M_start);
              att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = *(pointer *)pfVar18;
              att._0_64_ = CONCAT4024(auVar10,att.vertices.
                                              super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data);
            }
            att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)plVar14[1];
            *plVar14 = (long)pfVar18;
            plVar14[1] = 0;
            *(undefined1 *)(plVar14 + 2) = 0;
            ChVisualMaterial::SetMetallicTexture
                      ((ChVisualMaterial *)_Var8._M_p,(string *)&att,1.0,1.0);
            if ((pointer *)
                att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != ppfVar1) {
              operator_delete(att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl
                              .super__Vector_impl_data._M_start,
                              (long)att.vertices.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)warn._M_dataplus._M_p != &warn.field_2) {
              operator_delete(warn._M_dataplus._M_p,
                              CONCAT71(warn.field_2._M_allocated_capacity._1_7_,
                                       warn.field_2._M_local_buf[0]) + 1);
            }
          }
          iVar12 = std::__cxx11::string::compare
                             ((char *)((long)((materials.
                                               super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                             ambient_texopt).origin_offset + lVar20 + -0x50));
          if ((iVar12 != 0) &&
             ((__n = *(size_t *)
                      ((long)((materials.
                               super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                               ._M_impl.super__Vector_impl_data._M_start)->ambient_texopt).
                             origin_offset + lVar20 + -0x48),
              __n != *(size_t *)
                      ((long)(materials.
                              super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                              ._M_impl.super__Vector_impl_data._M_start)->emission + lVar20 + 0x48)
              || ((__n != 0 &&
                  (iVar12 = bcmp(*(void **)((long)((materials.
                                                                                                        
                                                  super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  ambient_texopt).origin_offset + lVar20 + -0x50),
                                 *(void **)((long)(materials.
                                                                                                      
                                                  super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  emission + lVar20 + 0x40),__n), iVar12 != 0))))))
          {
            _Var8._M_p = err._M_dataplus._M_p;
            warn._M_dataplus._M_p = (pointer)&warn.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&warn,mtl_base._M_dataplus._M_p,
                       mtl_base._M_dataplus._M_p + mtl_base._M_string_length);
            std::__cxx11::string::append((char *)&warn);
            plVar14 = (long *)std::__cxx11::string::_M_append
                                        ((char *)&warn,
                                         *(ulong *)((long)((materials.
                                                                                                                        
                                                  super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  ambient_texopt).origin_offset + lVar20 + -0x50));
            auVar4 = (undefined1  [64])att._0_64_;
            auVar9 = (undefined1  [56])att._8_56_;
            att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)ppfVar1;
            auVar5 = (undefined1  [64])att._0_64_;
            pfVar18 = (pointer)(plVar14 + 2);
            att._24_40_ = auVar4._24_40_;
            auVar10 = (undefined1  [40])att._24_40_;
            if ((pointer)*plVar14 == pfVar18) {
              att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._0_16_ = auVar5._0_16_;
              att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = *(pointer *)pfVar18;
              att._32_32_ = auVar4._32_32_;
              att.vertex_weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)plVar14[3];
            }
            else {
              att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)*plVar14;
              att._0_64_ = CONCAT568(auVar9,att.vertices.
                                            super__Vector_base<float,_std::allocator<float>_>.
                                            _M_impl.super__Vector_impl_data._M_start);
              att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = *(pointer *)pfVar18;
              att._0_64_ = CONCAT4024(auVar10,att.vertices.
                                              super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data);
            }
            att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)plVar14[1];
            *plVar14 = (long)pfVar18;
            plVar14[1] = 0;
            *(undefined1 *)(plVar14 + 2) = 0;
            ChVisualMaterial::SetOpacityTexture
                      ((ChVisualMaterial *)_Var8._M_p,(string *)&att,1.0,1.0);
            if ((pointer *)
                att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != ppfVar1) {
              operator_delete(att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl
                              .super__Vector_impl_data._M_start,
                              (long)att.vertices.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)warn._M_dataplus._M_p != &warn.field_2) {
              operator_delete(warn._M_dataplus._M_p,
                              CONCAT71(warn.field_2._M_allocated_capacity._1_7_,
                                       warn.field_2._M_local_buf[0]) + 1);
            }
          }
          std::
          vector<std::shared_ptr<chrono::ChVisualMaterial>,_std::allocator<std::shared_ptr<chrono::ChVisualMaterial>_>_>
          ::push_back(this_00,(value_type *)&err);
          if (err._M_string_length != 0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)err._M_string_length);
          }
          uVar22 = uVar22 + 1;
          lVar20 = lVar20 + 0x748;
          uVar15 = ((long)materials.
                          super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)materials.
                          super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x63fb9aeb1fdcd759;
        } while (uVar22 <= uVar15 && uVar15 - uVar22 != 0);
      }
      peVar21 = (this->trimesh).
                super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      piVar3 = (peVar21->m_face_mat_indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((peVar21->m_face_mat_indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish != piVar3) {
        (peVar21->m_face_mat_indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = piVar3;
      }
      if (shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar22 = 0;
        psVar16 = shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        psVar19 = shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        do {
          if (2 < (ulong)(((long)psVar16[uVar22].mesh.indices.
                                 super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)psVar16[uVar22].mesh.indices.
                                 super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 2) *
                         -0x5555555555555555)) {
            lVar20 = 0;
            uVar15 = 0;
            do {
              piVar3 = psVar16[uVar22].mesh.material_ids.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start;
              iVar12 = *(int *)((long)piVar3 + lVar20);
              if ((long)iVar12 < 0) {
                peVar21 = (this->trimesh).
                          super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr;
LAB_0081917e:
                auVar4._60_4_ = 0;
                auVar4._0_60_ = (undefined1  [60])att._4_60_;
                att._0_64_ = auVar4 << 0x20;
                __position._M_current =
                     (peVar21->m_face_mat_indices).super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
                if (__position._M_current ==
                    (peVar21->m_face_mat_indices).super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                            (&peVar21->m_face_mat_indices,__position,(int *)&att);
                }
                else {
                  *__position._M_current = 0;
LAB_0081919c:
                  (peVar21->m_face_mat_indices).super__Vector_base<int,_std::allocator<int>_>.
                  _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
                }
              }
              else {
                peVar21 = (this->trimesh).
                          super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr;
                if ((ulong)((long)(this->super_ChVisualShape).material_list.
                                  super__Vector_base<std::shared_ptr<chrono::ChVisualMaterial>,_std::allocator<std::shared_ptr<chrono::ChVisualMaterial>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->super_ChVisualShape).material_list.
                                  super__Vector_base<std::shared_ptr<chrono::ChVisualMaterial>,_std::allocator<std::shared_ptr<chrono::ChVisualMaterial>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 4) <=
                    (ulong)(long)iVar12) goto LAB_0081917e;
                __position._M_current =
                     (peVar21->m_face_mat_indices).super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
                if (__position._M_current !=
                    (peVar21->m_face_mat_indices).super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  *__position._M_current = iVar12;
                  goto LAB_0081919c;
                }
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)&peVar21->m_face_mat_indices,
                           __position,(int *)((long)piVar3 + lVar20));
              }
              uVar15 = uVar15 + 1;
              lVar20 = lVar20 + 4;
              psVar16 = shapes.
                        super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              psVar19 = shapes.
                        super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
            } while (uVar15 < (ulong)(((long)shapes.
                                             super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>
                                             ._M_impl.super__Vector_impl_data._M_start[uVar22].mesh.
                                             indices.
                                             super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)shapes.
                                             super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>
                                             ._M_impl.super__Vector_impl_data._M_start[uVar22].mesh.
                                             indices.
                                             super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>
                                             ._M_impl.super__Vector_impl_data._M_start >> 2) *
                                     -0x5555555555555555) / 3);
          }
          uVar22 = uVar22 + 1;
          uVar15 = ((long)psVar19 - (long)psVar16 >> 5) * 0x6db6db6db6db6db7;
        } while (uVar22 <= uVar15 && uVar15 - uVar22 != 0);
      }
      goto LAB_0081926a;
    }
  }
  if ((this->super_ChVisualShape).material_list.
      super__Vector_base<std::shared_ptr<chrono::ChVisualMaterial>,_std::allocator<std::shared_ptr<chrono::ChVisualMaterial>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->super_ChVisualShape).material_list.
      super__Vector_base<std::shared_ptr<chrono::ChVisualMaterial>,_std::allocator<std::shared_ptr<chrono::ChVisualMaterial>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    peVar21 = (this->trimesh).
              super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    auVar5._60_4_ = 0;
    auVar5._0_60_ = (undefined1  [60])att._4_60_;
    att._0_64_ = auVar5 << 0x20;
    std::vector<int,_std::allocator<int>_>::resize
              (&peVar21->m_face_mat_indices,
               ((long)(peVar21->m_face_v_indices).
                      super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(peVar21->m_face_v_indices).
                      super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555,
               (value_type_conflict2 *)&att);
  }
LAB_0081926a:
  std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::~vector(&materials);
  std::vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>::~vector(&shapes);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)mtl_base._M_dataplus._M_p != &mtl_base.field_2) {
    operator_delete(mtl_base._M_dataplus._M_p,mtl_base.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void ChTriangleMeshShape::SetMesh(std::shared_ptr<geometry::ChTriangleMeshConnected> mesh, bool load_materials) {
    trimesh = mesh;

    // Try to read material information form an MTL file
    const auto& filename = mesh->GetFileName();
    auto mtl_base = filesystem::path(filesystem::path(filename).parent_path()).str();
    std::vector<tinyobj::shape_t> shapes;
    std::vector<tinyobj::material_t> materials;
    bool have_mtl_materials = false;

    if (load_materials && !filename.empty()) {
        tinyobj::attrib_t att;
        std::string warn;
        std::string err;

        bool success = tinyobj::LoadObj(&att, &shapes, &materials, &warn, &err, filename.c_str(), mtl_base.c_str());
        if (!success) {
            std::cerr << "Error loading OBJ file " << filename << std::endl;
            std::cerr << "   tiny_obj warning message: " << warn << std::endl;
            std::cerr << "   tiny_obj error message:   " << err << std::endl;
            std::cerr << "No materials loaded." << std::endl;
            return;
        }

        if (!materials.empty())
            have_mtl_materials = true;
    }

    if (have_mtl_materials) {
        // Discard any existing materials in material_list
        material_list.clear();

        // Copy materials into material_list
        for (int i = 0; i < materials.size(); i++) {
            std::shared_ptr<ChVisualMaterial> mat = chrono_types::make_shared<ChVisualMaterial>();
            mat->SetAmbientColor({materials[i].ambient[0], materials[i].ambient[1], materials[i].ambient[2]});
            mat->SetDiffuseColor({materials[i].diffuse[0], materials[i].diffuse[1], materials[i].diffuse[2]});
            mat->SetSpecularColor({materials[i].specular[0], materials[i].specular[1], materials[i].specular[2]});
            mat->SetEmissiveColor({materials[i].emission[0], materials[i].emission[1], materials[i].emission[2]});
            mat->SetMetallic(materials[i].metallic);
            mat->SetOpacity(materials[i].dissolve);
            mat->SetIllumination(materials[i].illum);
            mat->SetRoughness(materials[i].roughness);
            mat->SetSpecularExponent(materials[i].shininess);

            // If metallic and roughness is set to default, use specular workflow
            if (materials[i].metallic == 0 && materials[i].roughness == 0.5) {
                mat->SetUseSpecularWorkflow(true);
            } else {
                mat->SetUseSpecularWorkflow(false);
            }

            if (materials[i].diffuse_texname != "") {
                mat->SetKdTexture(mtl_base + "/" + materials[i].diffuse_texname);
            }

            if (materials[i].specular_texname != "") {
                mat->SetKsTexture(mtl_base + "/" +  materials[i].specular_texname);
                mat->SetUseSpecularWorkflow(true);
            }
            // set normal map when called "bump_texname"
            if (materials[i].bump_texname != "") {
                mat->SetNormalMapTexture(mtl_base + "/" + materials[i].bump_texname);
            }
            // set normal map when called "normal_texname"
            if (materials[i].normal_texname != "") {
                mat->SetNormalMapTexture(mtl_base + "/" + materials[i].normal_texname);
            }
            // set roughness texture if it exists
            if (materials[i].roughness_texname != "") {
                mat->SetRoughnessTexture(mtl_base + "/" + materials[i].roughness_texname);
                mat->SetUseSpecularWorkflow(false);
            }
            // set metallic texture if it exists
            if (materials[i].metallic_texname != "") {
                mat->SetMetallicTexture(mtl_base + "/" + materials[i].metallic_texname);
            }
            // set opacity texture if it exists
            // NOTE: need to make sure alpha and diffuse names are different to prevent 4 channel opacity textures in
            // Chrono::Sensor
            if (materials[i].alpha_texname != "" && materials[i].alpha_texname != materials[i].diffuse_texname) {
                mat->SetOpacityTexture(mtl_base + "/" + materials[i].alpha_texname);
            }

            material_list.push_back(mat);
        }

        // For each shape, copy material_indices. Faces that reference an invalid material are assigned the first one.
        trimesh->m_face_mat_indices.clear();
        for (int i = 0; i < shapes.size(); i++) {
            for (int j = 0; j < shapes[i].mesh.indices.size() / 3; j++) {
                if (shapes[i].mesh.material_ids[j] < 0 || shapes[i].mesh.material_ids[j] >= material_list.size()) {
                    trimesh->m_face_mat_indices.push_back(0);
                } else {
                    trimesh->m_face_mat_indices.push_back(shapes[i].mesh.material_ids[j]);
                }
            }
        }
    } else if (!material_list.empty()) {
        // Assign all faces to first material
        auto nfaces = trimesh->m_face_v_indices.size();
        trimesh->m_face_mat_indices.resize(nfaces, 0);
    }
}